

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# singledocparser.cpp
# Opt level: O3

void __thiscall YAML::SingleDocParser::HandleMap(SingleDocParser *this,EventHandler *eventHandler)

{
  TYPE TVar1;
  Token *pTVar2;
  
  pTVar2 = Scanner::peek(this->m_scanner);
  TVar1 = pTVar2->type;
  if ((int)TVar1 < 0xe) {
    if (TVar1 == BLOCK_MAP_START) {
      HandleBlockMap(this,eventHandler);
      return;
    }
    if (TVar1 == FLOW_MAP_START) {
      HandleFlowMap(this,eventHandler);
      return;
    }
  }
  else {
    if (TVar1 == KEY) {
      HandleCompactMap(this,eventHandler);
      return;
    }
    if (TVar1 == VALUE) {
      HandleCompactMapWithNoKey(this,eventHandler);
      return;
    }
  }
  return;
}

Assistant:

void SingleDocParser::HandleMap(EventHandler& eventHandler) {
  // split based on start token
  switch (m_scanner.peek().type) {
    case Token::BLOCK_MAP_START:
      HandleBlockMap(eventHandler);
      break;
    case Token::FLOW_MAP_START:
      HandleFlowMap(eventHandler);
      break;
    case Token::KEY:
      HandleCompactMap(eventHandler);
      break;
    case Token::VALUE:
      HandleCompactMapWithNoKey(eventHandler);
      break;
    default:
      break;
  }
}